

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  char *__s;
  Offset OVar1;
  FuncTypeModuleField *pFVar2;
  undefined1 local_70 [8];
  Location loc;
  FuncTypeModuleField *local_40;
  _Head_base<0UL,_wabt::FuncTypeModuleField_*,_false> local_38;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = 0;
  loc.field_1._8_8_ = result_types;
  loc.filename.data_ = (char *)strlen(__s);
  local_70 = (undefined1  [8])__s;
  loc.filename.size_ = OVar1;
  MakeUnique<wabt::FuncTypeModuleField,wabt::Location>((wabt *)&local_40,(Location *)local_70);
  pFVar2 = local_40;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&(local_40->func_type).sig,param_types
             ,param_types + param_count);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&(pFVar2->func_type).sig.result_types,
             loc.field_1._8_8_,loc.field_1._8_8_ + (ulong)result_count * 4);
  local_38._M_head_impl = local_40;
  local_40 = (FuncTypeModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::FuncTypeModuleField,_std::default_delete<wabt::FuncTypeModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (FuncTypeModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (FuncTypeModuleField *)0x0;
  if (local_40 != (FuncTypeModuleField *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnType(Index index,
                              Index param_count,
                              Type* param_types,
                              Index result_count,
                              Type* result_types) {
  auto field = MakeUnique<FuncTypeModuleField>(GetLocation());
  FuncType& func_type = field->func_type;
  func_type.sig.param_types.assign(param_types, param_types + param_count);
  func_type.sig.result_types.assign(result_types, result_types + result_count);
  module_->AppendField(std::move(field));
  return Result::Ok;
}